

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O1

void __thiscall
QRasterPaintEnginePrivate::initializeRasterizer(QRasterPaintEnginePrivate *this,QSpanData *data)

{
  QRect *pQVar1;
  QPaintEngineState *pQVar2;
  QClipData *pQVar3;
  QPaintEngineState *pQVar4;
  ProcessSpans blend;
  long in_FS_OFFSET;
  QRect QVar5;
  QRect local_48;
  QRect local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = ((this->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.q_ptr)->state;
  pQVar4 = pQVar2 + -2;
  if (pQVar2 == (QPaintEngineState *)0x0) {
    pQVar4 = (QPaintEngineState *)0x0;
  }
  QRasterizer::setAntialiased
            ((this->rasterizer).d,
             SUB41(((ushort)pQVar4[0x105].dirtyFlags.
                            super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                            super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 8) >> 3,0));
  pQVar1 = &this->deviceRect;
  local_38.x1.m_i = (pQVar1->x1).m_i;
  local_38.y1.m_i = (pQVar1->y1).m_i;
  local_38.x2.m_i = (this->deviceRect).x2.m_i;
  local_38.y2.m_i = (this->deviceRect).y2.m_i;
  QVar5 = *pQVar1;
  pQVar4 = ((this->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.q_ptr)->state;
  if (((pQVar4 == (QPaintEngineState *)0x0) ||
      (pQVar3 = *(QClipData **)(pQVar4 + 0x100), pQVar3 == (QClipData *)0x0)) ||
     ((pQVar3->field_0x48 & 1) == 0)) {
    pQVar3 = (this->baseClip).d;
  }
  if (pQVar3 == (QClipData *)0x0) {
    blend = data->unclipped_blend;
  }
  else {
    local_48.y1.m_i = pQVar3->ymin;
    local_48.x1.m_i = pQVar3->xmin;
    local_48.y2.m_i = pQVar3->ymax + -1;
    local_48.x2.m_i = pQVar3->xmax + -1;
    QVar5 = (QRect)QRect::operator&(&local_38,&local_48);
    blend = data->blend;
  }
  local_38 = QVar5;
  QRasterizer::setClipRect((this->rasterizer).d,&local_38);
  QRasterizer::initialize((this->rasterizer).d,blend,data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEnginePrivate::initializeRasterizer(QSpanData *data)
{
    Q_Q(QRasterPaintEngine);
    QRasterPaintEngineState *s = q->state();

    rasterizer->setAntialiased(s->flags.antialiased);

    QRect clipRect(deviceRect);
    ProcessSpans blend;
    // ### get from optimized rectbased QClipData

    const QClipData *c = clip();
    if (c) {
        const QRect r(QPoint(c->xmin, c->ymin),
                      QSize(c->xmax - c->xmin, c->ymax - c->ymin));
        clipRect = clipRect.intersected(r);
        blend = data->blend;
    } else {
        blend = data->unclipped_blend;
    }

    rasterizer->setClipRect(clipRect);
    rasterizer->initialize(blend, data);
}